

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O1

void __thiscall
mp::pre::ValuePresolverImpl::
WriteNodes<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>>
          (ValuePresolverImpl *this,
          MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *jw,
          vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *nodes)

{
  uint uVar1;
  Node *this_00;
  pointer pNVar2;
  long lVar3;
  ulong uVar4;
  string_view key;
  string_view key_00;
  Node jelement;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_80;
  int local_6c;
  vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *local_68;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *local_60;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_58;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_40;
  
  pNVar2 = (nodes->super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((nodes->super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>)._M_impl.
      super__Vector_impl_data._M_finish != pNVar2) {
    lVar3 = 0xc;
    uVar4 = 0;
    local_68 = nodes;
    local_60 = jw;
    do {
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator++(&local_40);
      uVar1 = *(uint *)((long)pNVar2 + lVar3 + -4);
      if (uVar1 == *(int *)((long)&pNVar2->pvn_ + lVar3) - 1U) {
        key._M_str = *(char **)(*(long *)((long)pNVar2 + lVar3 + -0xc) + 0x60);
        key._M_len = (size_t)&local_40;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                  (&local_80,key);
        if (local_80.kind_ == Unset) {
          local_80.kind_ = Scalar;
        }
        local_58.wrt_ = (BasicMemoryWriter<char,_std::allocator<char>_> *)(ulong)uVar1;
        fmt::BasicWriter<char>::write
                  (&(local_80.wrt_)->super_BasicWriter<char>,0x3937a5,(void *)0x2,(size_t)&local_58)
        ;
        local_80.n_written_ = local_80.n_written_ + 1;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_80);
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_80);
      }
      else {
        key_00._M_str = *(char **)(*(long *)((long)pNVar2 + lVar3 + -0xc) + 0x60);
        key_00._M_len = (size_t)&local_40;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                  (&local_58,key_00);
        local_80.wrt_ =
             *(BasicMemoryWriter<char,_std::allocator<char>_> **)((long)pNVar2 + lVar3 + -4);
        this_00 = MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator<<
                            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)
                             &local_58,(int *)&local_80);
        local_6c = *(int *)((long)&pNVar2->pvn_ + lVar3) + -1;
        MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator<<
                  ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)this_00,
                   &local_6c);
        MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_58);
      }
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::Close(&local_40);
      uVar4 = uVar4 + 1;
      pNVar2 = (local_68->
               super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(local_68->
                                   super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 4))
    ;
  }
  return;
}

Assistant:

void WriteNodes(JSON jw, const std::vector<NodeRange>& nodes) {
    for (size_t i=0; i<nodes.size(); ++i) {
      const auto& nd = nodes[i];
      auto jelement = ++jw;       // jw is an array of dict's
      if (nd.IsSingleIndex())
        jelement[nd.GetValueNode()->GetName()] = (int)nd;
      else
        jelement[nd.GetValueNode()->GetName()]
            << nd.GetIndexRange().beg_
            << (nd.GetIndexRange().end_-1);  // print the exact last value
    }
  }